

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  LogMessage *pLVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  string *local_88;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_78;
  LogMessageFatal local_70 [23];
  Voidify local_59;
  string *local_58;
  string *absl_log_internal_check_op_result;
  byte local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [19];
  Voidify local_15;
  int local_14;
  CopyingInputStreamAdaptor *pCStack_10;
  int count_local;
  CopyingInputStreamAdaptor *this_local;
  
  local_39 = 0;
  bVar5 = false;
  local_14 = count;
  pCStack_10 = this;
  if (this->backup_bytes_ == 0) {
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->buffer_);
    bVar5 = puVar3 != (pointer)0x0;
  }
  if (!bVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"backup_bytes_ == 0 && buffer_.get() != NULL");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe5,local_38._M_len,local_38._M_str);
    local_39 = 1;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [43])" BackUp() can only be called after Next().");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_15,pLVar4);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(local_14);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->buffer_used_);
  local_58 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"count <= buffer_used_");
  if (local_58 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_78 = auVar6._8_8_;
    absl_log_internal_check_op_result_1 = auVar6._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe7,absl_log_internal_check_op_result_1,local_78);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_70);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [78])
                               " Can\'t back up over more bytes than were returned by the last call to Next()."
                       );
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_59,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(local_14);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_88 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"count >= 0");
  if (local_88 == (string *)0x0) {
    this->backup_bytes_ = local_14;
    return;
  }
  auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0xea,auVar6._0_8_,auVar6._8_8_);
  pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
  pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar4,(char (*) [42])" Parameter to BackUp() can\'t be negative.");
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  ABSL_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";
  ABSL_CHECK_GE(count, 0) << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}